

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

ElementsDecodeRawTransactionRequestStruct * __thiscall
cfd::api::json::ElementsDecodeRawTransactionRequest::ConvertToStruct
          (ElementsDecodeRawTransactionRequest *this)

{
  long in_RSI;
  ElementsDecodeRawTransactionRequestStruct *in_RDI;
  ElementsDecodeRawTransactionRequestStruct *unaff_retaddr;
  ElementsDecodeRawTransactionRequestStruct *result;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  ElementsDecodeRawTransactionRequestStruct *this_00;
  
  this_00 = in_RDI;
  ElementsDecodeRawTransactionRequestStruct::ElementsDecodeRawTransactionRequestStruct
            (unaff_retaddr);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)(in_RSI + 0x38));
  std::__cxx11::string::operator=((string *)&in_RDI->network,(string *)(in_RSI + 0x58));
  std::__cxx11::string::operator=((string *)&in_RDI->mainchain_network,(string *)(in_RSI + 0x78));
  in_RDI->iswitness = (bool)(*(byte *)(in_RSI + 0x98) & 1);
  in_RDI->full_dump = (bool)(*(byte *)(in_RSI + 0x99) & 1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,in_stack_ffffffffffffffb8);
  return this_00;
}

Assistant:

ElementsDecodeRawTransactionRequestStruct ElementsDecodeRawTransactionRequest::ConvertToStruct() const {  // NOLINT
  ElementsDecodeRawTransactionRequestStruct result;
  result.hex = hex_;
  result.network = network_;
  result.mainchain_network = mainchain_network_;
  result.iswitness = iswitness_;
  result.full_dump = full_dump_;
  result.ignore_items = ignore_items;
  return result;
}